

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linquadfelshaped.cc
# Opt level: O0

VectorXd solvePoisson(shared_ptr<const_lf::mesh::Mesh> *mesh,
                     shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *fe_space)

{
  int iVar1;
  size_type num_rows;
  size_type num_cols;
  uint uVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  __shared_ptr_access<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDX;
  Index extraout_RDX;
  VectorXd VVar5;
  Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_470;
  undefined1 local_459;
  undefined1 local_458 [8];
  SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> solver;
  SparseMatrix<double,_0,_int> A;
  anon_class_32_4_e2ee8f54 selector;
  AllCodimMeshDataSet<bool> boundary;
  undefined1 local_2e8 [8];
  VectorXd rhs;
  COOMatrix<double> A_COO;
  DofHandler *dofh;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> local_290;
  undefined1 local_280 [8];
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
  element_matrix_provider;
  MeshFunctionConstant<double> mf_gamma;
  MeshFunctionConstant<double> mf_alpha;
  anon_class_1_0_00000001 u_bd;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *fe_space_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  VectorXd *solution;
  DofHandler *dof_handler_trial;
  
  mf_alpha.value_._7_1_ = 0;
  lf::mesh::utils::MeshFunctionConstant<double>::MeshFunctionConstant(&mf_gamma,1.0);
  lf::mesh::utils::MeshFunctionConstant<double>::MeshFunctionConstant
            ((MeshFunctionConstant<double> *)
             &element_matrix_provider.fe_precomp_._M_elems[4].grad_shape_fun_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,0.0)
  ;
  std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::shared_ptr
            (&local_290,(shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)in_RDX);
  lf::uscalfe::
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
  ::ReactionDiffusionElementMatrixProvider
            ((ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
              *)local_280,&local_290,mf_gamma,
             (MeshFunctionConstant<double>)
             element_matrix_provider.fe_precomp_._M_elems[4].grad_shape_fun_.
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  std::shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_>::~shared_ptr(&local_290);
  peVar3 = std::
           __shared_ptr_access<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_RDX);
  iVar1 = (*(peVar3->super_ScalarFESpace<double>)._vptr_ScalarFESpace[1])();
  dof_handler_trial = (DofHandler *)CONCAT44(extraout_var,iVar1);
  num_rows = (*dof_handler_trial->_vptr_DofHandler[2])();
  num_cols = (*dof_handler_trial->_vptr_DofHandler[2])();
  lf::assemble::COOMatrix<double>::COOMatrix
            ((COOMatrix<double> *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             num_rows,num_cols);
  uVar2 = (*dof_handler_trial->_vptr_DofHandler[2])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&boundary.data_.m_holder.m_capacity,(ulong)uVar2);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_2e8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&boundary.data_.m_holder.m_capacity);
  poVar4 = std::operator<<((ostream *)&std::cout,"\t\t> Assembling System Matrix");
  std::operator<<(poVar4,'\n');
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::uscalfe::ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>_>
            (0,dof_handler_trial,dof_handler_trial,
             (ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
              *)local_280,
             (COOMatrix<double> *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  poVar4 = std::operator<<((ostream *)&std::cout,"\t\t> Enforcing Boundary Conditions");
  std::operator<<(poVar4,'\n');
  lf::mesh::utils::flagEntitiesOnBoundary
            ((AllCodimMeshDataSet<bool> *)&selector.u_bd,
             (shared_ptr<const_lf::mesh::Mesh> *)fe_space);
  selector.dofh = (DofHandler *)&selector.u_bd;
  selector.fe_space =
       (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)((long)&mf_alpha.value_ + 7);
  A.m_data.m_allocatedSize = (Index)dof_handler_trial;
  lf::assemble::
  FixFlaggedSolutionComponents<double,solvePoisson(std::shared_ptr<lf::mesh::Mesh_const>const&,std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>const>const&)::__0_const&,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((anon_class_32_4_e2ee8f54 *)&A.m_data.m_allocatedSize,
             (COOMatrix<double> *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_2e8);
  poVar4 = std::operator<<((ostream *)&std::cout,"\t\t> Solving LSE");
  std::operator<<(poVar4,'\n');
  lf::assemble::COOMatrix<double>::makeSparse
            ((SparseMatrix<double,_0,_int> *)
             &solver.
              super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
              .m_shiftScale,
             (COOMatrix<double> *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
  SimplicialLDLT((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *
                 )local_458,
                 (MatrixType *)
                 &solver.
                  super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                  .m_shiftScale);
  local_459 = 0;
  local_470 = Eigen::
              SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
              ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
                          *)local_458,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_2e8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)mesh,
             (EigenBase<Eigen::Solve<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_470);
  local_459 = 1;
  Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
  ~SimplicialLDLT((SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>
                   *)local_458);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)
             &solver.
              super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
              .m_shiftScale);
  lf::mesh::utils::AllCodimMeshDataSet<bool>::~AllCodimMeshDataSet
            ((AllCodimMeshDataSet<bool> *)&selector.u_bd);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_2e8);
  lf::assemble::COOMatrix<double>::~COOMatrix
            ((COOMatrix<double> *)
             &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  lf::uscalfe::
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
  ::~ReactionDiffusionElementMatrixProvider
            ((ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::mesh::utils::MeshFunctionConstant<double>_>
              *)local_280);
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)mesh;
  return (VectorXd)VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd solvePoisson(
    const std::shared_ptr<const lf::mesh::Mesh> &mesh,
    const std::shared_ptr<const lf::uscalfe::UniformScalarFESpace<double>>
        &fe_space) {
  // Define the boundary values
  const auto u_bd = [](const Eigen::Vector2d &x) -> double {
    const double r = x.norm();
    double phi = std::atan2(x[1], x[0]);
    if (phi < 0) {
      phi += 2 * lf::base::kPi;
    }
    return std::pow(r, 2. / 3) * std::sin(2. / 3 * phi);
  };

  // Initialize the matrix provider
  const lf::mesh::utils::MeshFunctionConstant<double> mf_alpha(1);
  const lf::mesh::utils::MeshFunctionConstant<double> mf_gamma(0);
  lf::uscalfe::ReactionDiffusionElementMatrixProvider element_matrix_provider(
      fe_space, mf_alpha, mf_gamma);

  // Assemble the system matrix (RHS is zero because we have no load)
  const lf::assemble::DofHandler &dofh = fe_space->LocGlobMap();
  lf::assemble::COOMatrix<double> A_COO(dofh.NumDofs(), dofh.NumDofs());
  Eigen::VectorXd rhs = Eigen::VectorXd::Zero(dofh.NumDofs());
  std::cout << "\t\t> Assembling System Matrix" << '\n';
  lf::assemble::AssembleMatrixLocally(0, dofh, dofh, element_matrix_provider,
                                      A_COO);

  // Enforce the dirichlet boundary conditions
  std::cout << "\t\t> Enforcing Boundary Conditions" << '\n';
  const auto boundary = lf::mesh::utils::flagEntitiesOnBoundary(mesh);
  const auto selector = [&](unsigned int idx) -> std::pair<bool, double> {
    const lf::mesh::Entity &entity = dofh.Entity(idx);
    if (!boundary(entity)) {
      return {false, 0};
    }
    const lf::geometry::Geometry *geom = entity.Geometry();
    // Find out where the evaluation node corresponding to the DOF is
    const auto *const shape_function_layout =
        fe_space->ShapeFunctionLayout(entity.RefEl());
    const auto num_dofs = dofh.NumLocalDofs(entity);
    const auto glob_dof_idxs = dofh.GlobalDofIndices(entity);
    int dof_idx;
    for (dof_idx = 0; dof_idx < num_dofs; ++dof_idx) {
      if (glob_dof_idxs[dof_idx] == idx) {
        break;
      }
    }
    const Eigen::VectorXd eval_node =
        shape_function_layout->EvaluationNodes().col(dof_idx);
    const Eigen::Vector2d pos = geom->Global(eval_node);
    // Return the value on the boundary at the position of the evaluation node
    // corresponding to the dof
    return {true, u_bd(pos)};
  };
  lf::assemble::FixFlaggedSolutionComponents(selector, A_COO, rhs);

  // Solve the LSE using Cholesky decomposition
  std::cout << "\t\t> Solving LSE" << '\n';
  const Eigen::SparseMatrix<double> A = A_COO.makeSparse();
  const Eigen::SimplicialLDLT<Eigen::SparseMatrix<double>> solver(A);
  Eigen::VectorXd solution = solver.solve(rhs);

  // Return the resulting solution vector
  return solution;
}